

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hrss.cc
# Opt level: O2

void poly_marshal(uint8_t *out,poly *in)

{
  byte bVar1;
  long lVar2;
  uint16_t *p;
  
  lVar2 = 0;
  while( true ) {
    *out = *(uint8_t *)((long)&in->field_0 + lVar2);
    out[1] = (char)*(undefined2 *)((long)&in->field_0 + lVar2 + 2) << 5 |
             *(byte *)((long)&in->field_0 + lVar2 + 1) & 0x1f;
    out[2] = (uint8_t)(*(ushort *)((long)&in->field_0 + lVar2 + 2) >> 3);
    out[3] = ((byte)((ushort)*(undefined2 *)((long)&in->field_0 + lVar2 + 2) >> 0xb) & 3) +
             (char)*(undefined2 *)((long)&in->field_0 + lVar2 + 4) * '\x04';
    out[4] = (char)*(undefined2 *)((long)&in->field_0 + lVar2 + 6) << 7 |
             (byte)(*(ushort *)((long)&in->field_0 + lVar2 + 4) >> 6) & 0x7f;
    out[5] = (uint8_t)(*(ushort *)((long)&in->field_0 + lVar2 + 6) >> 1);
    bVar1 = (byte)((ushort)*(undefined2 *)((long)&in->field_0 + lVar2 + 6) >> 8);
    if (lVar2 == 0x570) break;
    out[6] = (char)*(undefined2 *)((long)&in->field_0 + lVar2 + 8) << 4 | bVar1 >> 1 & 0xf;
    out[7] = (uint8_t)(*(ushort *)((long)&in->field_0 + lVar2 + 8) >> 4);
    out[8] = ((byte)((ushort)*(undefined2 *)((long)&in->field_0 + lVar2 + 8) >> 0xc) & 1) +
             (char)*(undefined2 *)((long)&in->field_0 + lVar2 + 10) * '\x02';
    out[9] = (char)*(undefined2 *)((long)&in->field_0 + lVar2 + 0xc) << 6 |
             (byte)(*(ushort *)((long)&in->field_0 + lVar2 + 10) >> 7) & 0x3f;
    out[10] = (uint8_t)(*(ushort *)((long)&in->field_0 + lVar2 + 0xc) >> 2);
    out[0xb] = ((byte)((ushort)*(undefined2 *)((long)&in->field_0 + lVar2 + 0xc) >> 10) & 7) +
               (char)*(undefined2 *)((long)&in->field_0 + lVar2 + 0xe) * '\b';
    out[0xc] = (uint8_t)(*(ushort *)((long)&in->field_0 + lVar2 + 0xe) >> 5);
    out = out + 0xd;
    lVar2 = lVar2 + 0x10;
  }
  out[6] = bVar1 >> 1 & 0xf;
  return;
}

Assistant:

static void poly_marshal(uint8_t out[POLY_BYTES], const struct poly *in) {
  const uint16_t *p = in->v;

  for (size_t i = 0; i < N / 8; i++) {
    out[0] = p[0];
    out[1] = (0x1f & (p[0] >> 8)) | ((p[1] & 0x07) << 5);
    out[2] = p[1] >> 3;
    out[3] = (3 & (p[1] >> 11)) | ((p[2] & 0x3f) << 2);
    out[4] = (0x7f & (p[2] >> 6)) | ((p[3] & 0x01) << 7);
    out[5] = p[3] >> 1;
    out[6] = (0xf & (p[3] >> 9)) | ((p[4] & 0x0f) << 4);
    out[7] = p[4] >> 4;
    out[8] = (1 & (p[4] >> 12)) | ((p[5] & 0x7f) << 1);
    out[9] = (0x3f & (p[5] >> 7)) | ((p[6] & 0x03) << 6);
    out[10] = p[6] >> 2;
    out[11] = (7 & (p[6] >> 10)) | ((p[7] & 0x1f) << 3);
    out[12] = p[7] >> 5;

    p += 8;
    out += 13;
  }

  // There are four remaining values.
  out[0] = p[0];
  out[1] = (0x1f & (p[0] >> 8)) | ((p[1] & 0x07) << 5);
  out[2] = p[1] >> 3;
  out[3] = (3 & (p[1] >> 11)) | ((p[2] & 0x3f) << 2);
  out[4] = (0x7f & (p[2] >> 6)) | ((p[3] & 0x01) << 7);
  out[5] = p[3] >> 1;
  out[6] = 0xf & (p[3] >> 9);
}